

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Cnf_Dat_t * Acb_NtkDeriveMiterCnf(Gia_Man_t *p,int iTar,int nTars,int fVerbose)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *pInit;
  Gia_Man_t *p_00;
  Cnf_Dat_t *pCVar3;
  Gia_Man_t *pTemp;
  int v;
  Cnf_Dat_t *pCnf;
  Gia_Man_t *pCof;
  int fVerbose_local;
  int nTars_local;
  int iTar_local;
  Gia_Man_t *p_local;
  
  pCnf = (Cnf_Dat_t *)Gia_ManDup(p);
  pTemp._4_4_ = 0;
  while( true ) {
    if (iTar <= (int)pTemp._4_4_) {
      if (fVerbose != 0) {
        printf("M_quo: ");
        Gia_ManPrintStats((Gia_Man_t *)pCnf,(Gps_Par_t *)0x0);
        printf("M_syn: ");
        Gia_ManPrintStats((Gia_Man_t *)pCnf,(Gps_Par_t *)0x0);
      }
      pCVar3 = (Cnf_Dat_t *)Mf_ManGenerateCnf((Gia_Man_t *)pCnf,8,0,0,0,0);
      Gia_ManStop((Gia_Man_t *)pCnf);
      return pCVar3;
    }
    iVar1 = Gia_ManCiNum((Gia_Man_t *)pCnf);
    pInit = Gia_ManDupUniv((Gia_Man_t *)pCnf,(iVar1 - nTars) + pTemp._4_4_);
    p_00 = Gia_ManAigSyn2(pInit,0,1,0,100,0,0,0);
    Gia_ManStop(pInit);
    iVar1 = Gia_ManAndNum(p_00);
    if (10000 < iVar1) {
      printf("Quantifying target %3d ",(ulong)pTemp._4_4_);
      Gia_ManPrintStats(p_00,(Gps_Par_t *)0x0);
    }
    iVar1 = Gia_ManCiNum(p_00);
    iVar2 = Gia_ManCiNum((Gia_Man_t *)pCnf);
    if (iVar1 != iVar2) break;
    Gia_ManStop((Gia_Man_t *)pCnf);
    pTemp._4_4_ = pTemp._4_4_ + 1;
    pCnf = (Cnf_Dat_t *)p_00;
  }
  __assert_fail("Gia_ManCiNum(pCof) == Gia_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                ,0x917,"Cnf_Dat_t *Acb_NtkDeriveMiterCnf(Gia_Man_t *, int, int, int)");
}

Assistant:

Cnf_Dat_t * Acb_NtkDeriveMiterCnf( Gia_Man_t * p, int iTar, int nTars, int fVerbose )
{
    Gia_Man_t * pCof = Gia_ManDup( p );
    Cnf_Dat_t * pCnf; int v;
    for ( v = 0; v < iTar; v++ )
    {
        Gia_Man_t * pTemp;
        pCof = Gia_ManDupUniv( p = pCof, Gia_ManCiNum(pCof) - nTars + v );
        //pCof = Acb_NtkEcoSynthesize( pTemp = pCof );
        //pCof = Gia_ManCompress2( pTemp = pCof, 1, 0 );
        pCof = Gia_ManAigSyn2( pTemp = pCof, 0, 1, 0, 100, 0, 0, 0 );
        Gia_ManStop( pTemp );
        if ( Gia_ManAndNum(pCof) > 10000 )
        {
            printf( "Quantifying target %3d ", v );
            Gia_ManPrintStats( pCof, NULL );
        }
        assert( Gia_ManCiNum(pCof) == Gia_ManCiNum(p) );
        Gia_ManStop( p );
    }
    if ( fVerbose ) printf( "M_quo: " );
    if ( fVerbose ) Gia_ManPrintStats( pCof, NULL );
    //pCof = Acb_NtkEcoSynthesize( p = pCof );
    //Gia_ManStop( p );
    if ( fVerbose ) printf( "M_syn: " );
    if ( fVerbose ) Gia_ManPrintStats( pCof, NULL );
    if ( 0 && iTar < nTars )
    {
        Gia_Man_t * pCof0 = Gia_ManDupCofactorVar( pCof, Gia_ManCiNum(pCof) - nTars + iTar, 0 );
        Gia_Man_t * pCof1 = Gia_ManDupCofactorVar( pCof, Gia_ManCiNum(pCof) - nTars + iTar, 1 );
        pCof0 = Acb_NtkEcoSynthesize( p = pCof0 );
        Gia_ManStop( p );
        pCof1 = Acb_NtkEcoSynthesize( p = pCof1 );
        Gia_ManStop( p );
        Gia_AigerWrite( pCof0, "eco_qbf0.aig", 0, 0, 0 );
        Gia_AigerWrite( pCof1, "eco_qbf1.aig", 0, 0, 0 );
        Gia_ManStop( pCof0 );
        Gia_ManStop( pCof1 );
        printf( "Dumped cof0 into file \"%s\".\n", "eco_qbf0.aig" );
        printf( "Dumped cof1 into file \"%s\".\n", "eco_qbf1.aig" );
    }
//    Gia_AigerWrite( pCof, "eco_qbf.aig", 0, 0, 0 );
//    printf( "Dumped the result of quantification into file \"%s\".\n", "eco_qbf.aig" );
    pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pCof, 8, 0, 0, 0, 0 );
    Gia_ManStop( pCof );
    return pCnf;
}